

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

void __thiscall cp::PlanFootprints::calcEndCP(PlanFootprints *this)

{
  double dVar1;
  double dVar2;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  PlanFootprints *this_local;
  
  if ((*(int *)(this + 0x308) == 4) || (*(int *)(this + 0x308) == 3)) {
    pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10));
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x(pDVar3);
    dVar1 = *pSVar4;
    dVar2 = *(double *)(this + 0x508);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)(this + 0x2d0),0
                       );
    *pSVar5 = dVar1 + dVar2;
    pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             Pose::p((Pose *)(this + 0x10));
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar3);
    dVar1 = *pSVar4;
    pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             Pose::p((Pose *)(this + 0xf0));
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar3);
    dVar2 = *pSVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)(this + 0x2d0),1
                       );
    *pSVar5 = (dVar1 + dVar2) * 0.5;
  }
  else {
    pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10));
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x(pDVar3);
    dVar1 = *pSVar4;
    dVar2 = *(double *)(this + 0x508);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)(this + 0x2d0),0
                       );
    *pSVar5 = dVar1 + dVar2;
    if (*(int *)(this + 0x2e0) == 0) {
      pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10));
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar3);
      dVar1 = *pSVar4;
      dVar2 = *(double *)(this + 0x510);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)(this + 0x2d0)
                          ,1);
      *pSVar5 = dVar1 + dVar2;
    }
    else {
      pDVar3 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
               Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10));
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar3);
      dVar1 = *pSVar4;
      dVar2 = *(double *)(this + 0x510);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1> *)(this + 0x2d0)
                          ,1);
      *pSVar5 = dVar1 - dVar2;
    }
  }
  return;
}

Assistant:

void PlanFootprints::calcEndCP() {
  if (wstate == stopping2 || wstate == stopping1) {
    end_cp[0] = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    end_cp[1] = (ref_land_pose[0].p().y() + ref_land_pose[1].p().y()) * 0.5;
  } else {
    end_cp[0] = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    if (swingleg == right) {
      end_cp[1] = ref_land_pose[swingleg].p().y() + end_cp_offset[1];
    } else {
      end_cp[1] = ref_land_pose[swingleg].p().y() - end_cp_offset[1];
    }
  }
}